

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O3

pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::avx::GridSOA::buildBVH
          (pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,GridRange *range,size_t *allocator)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint v_size;
  uint uVar10;
  int iVar11;
  undefined1 (*pauVar12) [16];
  uint u_size_1;
  uint v_size_1;
  ulong uVar13;
  uint u_size;
  uint uVar14;
  GridRange *range_00;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> node_bounds;
  pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> local_c8;
  GridRange local_98;
  undefined1 local_88 [8];
  uint auStack_80 [10];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  uVar8 = range->u_start;
  if ((range->u_end - uVar8) + 1 < 4) {
    uVar2 = range->v_end;
    uVar7 = range->v_start;
    uVar16 = (ulong)uVar7;
    if ((uVar2 - uVar7) + 1 < 4) {
      uVar15 = this->width;
      lVar9 = uVar15 * uVar16;
      if (uVar2 < uVar7) {
        aVar20.m128[2] = INFINITY;
        aVar20._0_8_ = 0x7f8000007f800000;
        aVar20.m128[3] = INFINITY;
        aVar18.m128[2] = -INFINITY;
        aVar18._0_8_ = 0xff800000ff800000;
        aVar18.m128[3] = -INFINITY;
      }
      else {
        uVar13 = (ulong)this->gridOffset;
        iVar11 = uVar7 * uVar15;
        auVar19 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        auVar21 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        uVar7 = uVar8;
        do {
          while( true ) {
            aVar20 = auVar21._0_16_;
            aVar18 = auVar19._0_16_;
            if (range->u_end < uVar7) break;
            uVar17 = (ulong)(iVar11 + uVar7);
            auVar5 = vinsertps_avx(ZEXT416(*(uint *)(this->data + uVar17 * 4 + uVar13)),
                                   ZEXT416(*(uint *)(this->data +
                                                    uVar17 * 4 +
                                                    (ulong)this->dim_offset * 4 + uVar13)),0x1c);
            auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(this->data +
                                                           uVar17 * 4 +
                                                           (ulong)(this->dim_offset * 2) * 4 +
                                                           uVar13)),0x28);
            auVar4 = vminps_avx((undefined1  [16])aVar20,auVar5);
            auVar21 = ZEXT1664(auVar4);
            auVar5 = vmaxps_avx((undefined1  [16])aVar18,auVar5);
            auVar19 = ZEXT1664(auVar5);
            uVar7 = uVar7 + 1;
          }
          uVar10 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar10;
          iVar11 = iVar11 + uVar15;
          uVar7 = uVar8;
        } while (uVar10 <= uVar2);
      }
      (__return_storage_ptr__->first).ptr = (lVar9 + (ulong)uVar8) * 0x10 + 0x18;
      (__return_storage_ptr__->second).lower.field_0 = aVar20;
      (__return_storage_ptr__->second).upper.field_0 = aVar18;
      return __return_storage_ptr__;
    }
  }
  sVar3 = *allocator;
  *allocator = sVar3 + 0x80;
  local_48.m128[2] = INFINITY;
  local_48._0_8_ = 0x7f8000007f800000;
  local_48.m128[3] = INFINITY;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar3 - 0x10)) = local_48;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar3 - 0x30)) = local_48;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar3 - 0x18)) = local_48;
  aVar22.m128[2] = -INFINITY;
  aVar22._0_8_ = 0xff800000ff800000;
  aVar22.m128[3] = -INFINITY;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + sVar3) = aVar22;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar3 - 0x20)) = aVar22;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar3 - 8)) = aVar22;
  pcVar1 = this->data + sVar3;
  *(undefined8 *)pcVar1 = 8;
  *(undefined8 *)(pcVar1 + 8) = 8;
  *(undefined8 *)(pcVar1 + 0x10) = 8;
  *(undefined8 *)(pcVar1 + 0x18) = 8;
  local_98.u_start = range->u_start;
  uVar8 = range->u_end;
  uVar2 = range->v_end;
  local_98.v_start = range->v_start;
  if ((uVar8 - local_98.u_start) + 1 < (uVar2 - local_98.v_start) + 1) {
    uVar7 = local_98.v_start + uVar2 >> 1;
    uVar15 = local_98.u_start;
    local_98.u_end = uVar8;
    local_98.v_end = uVar7;
  }
  else {
    uVar15 = local_98.u_start + uVar8 >> 1;
    uVar7 = local_98.v_start;
    local_98.u_end = uVar15;
    local_98.v_end = uVar2;
  }
  uVar14 = (local_98.u_end - local_98.u_start) + 1;
  uVar10 = (local_98.v_end - local_98.v_start) + 1;
  if ((uVar10 | uVar14) < 4) {
    iVar11 = 1;
  }
  else {
    auVar5 = vpinsrd_avx(ZEXT416(local_98.u_start),local_98.u_end,1);
    auVar5 = vpinsrd_avx(auVar5,local_98.v_start,2);
    auVar5 = vpinsrd_avx(auVar5,local_98.v_end,3);
    if (uVar14 < uVar10) {
      local_98.v_end = local_98.v_end + local_98.v_start >> 1;
      local_98._0_12_ = auVar5._0_12_;
      auStack_80[1] = auVar5._12_4_;
      local_88 = auVar5._0_8_;
      auStack_80[0] = local_98.v_end;
    }
    else {
      local_98.u_end = local_98.u_end + local_98.u_start >> 1;
      local_98._8_8_ = auVar5._8_8_;
      local_98.u_start = auVar5._0_4_;
      stack0xffffffffffffff7c = auVar5._4_12_;
      local_88._0_4_ = local_98.u_end;
    }
    iVar11 = 2;
  }
  uVar10 = (uVar8 - uVar15) + 1;
  uVar14 = (uVar2 - uVar7) + 1;
  uVar16 = (ulong)(uint)(iVar11 << 4);
  pauVar12 = (undefined1 (*) [16])((long)&local_98.u_start + uVar16);
  if ((uVar10 | uVar14) < 4) {
    *(uint *)*pauVar12 = uVar15;
    *(uint *)((long)&local_98.u_end + uVar16) = uVar8;
    *(uint *)((long)&local_98.v_start + uVar16) = uVar7;
    *(uint *)(local_88 + (uVar16 - 4)) = uVar2;
    iVar6 = 1;
  }
  else {
    auVar5 = vpinsrd_avx(ZEXT416(uVar15),uVar8,1);
    auVar5 = vpinsrd_avx(auVar5,uVar7,2);
    auVar5 = vpinsrd_avx(auVar5,uVar2,3);
    *(undefined1 (*) [16])(local_88 + uVar16) = auVar5;
    *pauVar12 = auVar5;
    if (uVar10 < uVar14) {
      uVar8 = uVar7 + uVar2 >> 1;
      *(uint *)(local_88 + (uVar16 - 4)) = uVar8;
      *(uint *)((long)auStack_80 + uVar16) = uVar8;
    }
    else {
      uVar8 = uVar15 + uVar8 >> 1;
      *(uint *)((long)&local_98.u_end + uVar16) = uVar8;
      *(uint *)(local_88 + uVar16) = uVar8;
    }
    iVar6 = 2;
  }
  range_00 = &local_98;
  uVar16 = 0;
  do {
    local_58 = aVar22;
    buildBVH(&local_c8,this,range_00,allocator);
    *(float *)(this[1].data + uVar16 * 4 + sVar3 + -0x18) = local_c8.second.lower.field_0.m128[0];
    *(float *)(this[2].data + uVar16 * 4 + sVar3 + -0x30) = local_c8.second.lower.field_0.m128[1];
    *(float *)(this[2].data + uVar16 * 4 + sVar3 + -0x10) = local_c8.second.lower.field_0.m128[2];
    *(float *)(this[1].data + uVar16 * 4 + sVar3 + -8) = local_c8.second.upper.field_0.m128[0];
    *(float *)(this[2].data + uVar16 * 4 + sVar3 + -0x20) = local_c8.second.upper.field_0.m128[1];
    *(float *)(this[2].data + uVar16 * 4 + sVar3) = local_c8.second.upper.field_0.m128[2];
    *(size_t *)(this->data + uVar16 * 8 + sVar3) = local_c8.first.ptr;
    auVar5._4_4_ = local_c8.second.lower.field_0.m128[1];
    auVar5._0_4_ = local_c8.second.lower.field_0.m128[0];
    auVar5._8_4_ = local_c8.second.lower.field_0.m128[2];
    auVar5._12_4_ = local_c8.second.lower.field_0.m128[3];
    local_48.m128 = (__m128)vminps_avx(local_48.m128,auVar5);
    auVar4._4_4_ = local_c8.second.upper.field_0.m128[1];
    auVar4._0_4_ = local_c8.second.upper.field_0.m128[0];
    auVar4._8_4_ = local_c8.second.upper.field_0.m128[2];
    auVar4._12_4_ = local_c8.second.upper.field_0.m128[3];
    aVar22.m128 = (__m128)vmaxps_avx(local_58.m128,auVar4);
    uVar16 = uVar16 + 1;
    range_00 = range_00 + 1;
  } while ((uint)(iVar11 + iVar6) != uVar16);
  (__return_storage_ptr__->first).ptr = (size_t)(this->data + sVar3);
  (__return_storage_ptr__->second).lower.field_0 = local_48;
  (__return_storage_ptr__->second).upper.field_0 = aVar22;
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,BBox3fa> GridSOA::buildBVH(const GridRange& range, size_t& allocator)
    {
      /*! create leaf node */
      if (unlikely(range.hasLeafSize()))
      {
        /* we store index of first subgrid vertex as leaf node */
        BVH4::NodeRef curNode = BVH4::encodeTypedLeaf(encodeLeaf(range.u_start,range.v_start),0);

        /* return bounding box */
        return std::make_pair(curNode,calculateBounds(0,range));
      }
      
      /* create internal node */
      else 
      {
        /* allocate new bvh4 node */
        BVH4::AABBNode* node = (BVH4::AABBNode *)&bvhData()[allocator];
        allocator += sizeof(BVH4::AABBNode);
        node->clear();
        
        /* split range */
        GridRange r[4];
        const unsigned children = range.splitIntoSubRanges(r);
      
        /* recurse into subtrees */
        BBox3fa bounds( empty );
        for (unsigned i=0; i<children; i++)
        {
          std::pair<BVH4::NodeRef,BBox3fa> node_bounds = buildBVH(r[i], allocator);
          node->set(i,node_bounds.first,node_bounds.second);
          bounds.extend(node_bounds.second);
        }
        assert(is_finite(bounds));
        return std::make_pair(BVH4::encodeNode(node),bounds);
      }
    }